

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::SerializeWithCachedSizes
          (ItemSimilarityRecommender_SimilarItems *this,CodedOutputStream *output)

{
  double value;
  int iVar1;
  Type *value_00;
  int index;
  
  if (this->itemid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->itemid_,output);
  }
  iVar1 = (this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
                           (&(this->similaritemlist_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage
                (2,&value_00->super_MessageLite,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  value = this->itemscoreadjustment_;
  if ((value == 0.0) && (!NAN(value))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(3,value,output);
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 itemId = 1;
  if (this->itemid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->itemid(), output);
  }

  // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
  for (unsigned int i = 0, n = this->similaritemlist_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->similaritemlist(i), output);
  }

  // double itemScoreAdjustment = 3;
  if (this->itemscoreadjustment() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(3, this->itemscoreadjustment(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
}